

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O2

int Abc_NtkTestScorrWriteEquivAig(Tst_Dat_t *pData)

{
  Abc_Ntk_t *pNetlist;
  Aig_Man_t *pAVar1;
  Vec_Int_t *vId2Name;
  Aig_Obj_t *pAVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  char *pName;
  uint uVar5;
  int i;
  
  pNetlist = pData->pNetlist;
  pAVar1 = pData->pAig;
  vId2Name = pData->vId2Name;
  pName = pData->pFileNameOut;
  if (pData->fDumpBmc != 0) {
    pData->fDumpBmc = 0;
    Abc_NtkBmcFileName(pName);
    pName = Abc_NtkBmcFileName::Buffer;
  }
  __stream = fopen(pName,"wb");
  i = 0;
  uVar5 = 0;
  do {
    if (pAVar1->vObjs->nSize <= i) {
      fclose(__stream);
      printf("%d pairs of sequentially equivalent nodes are written into file \"%s\".\n",
             (ulong)uVar5,pName);
      return uVar5;
    }
    piVar4 = (int *)Vec_PtrEntry(pAVar1->vObjs,i);
    if ((piVar4 != (int *)0x0) && (pAVar1->pReprs != (Aig_Obj_t **)0x0)) {
      iVar3 = piVar4[9];
      pAVar2 = pAVar1->pReprs[iVar3];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        if (pData->fFlopOnly == 0) {
          if (((pData->fFfNdOnly != 0) && (((piVar4[6] & 7U) != 2 || (*piVar4 < pAVar1->nTruePis))))
             && (((*(uint *)&pAVar2->field_0x18 & 7) != 2 ||
                 ((pAVar2->field_0).CioId < pAVar1->nTruePis)))) {
LAB_002c1502:
            if (pAVar2 != pAVar1->pConst1) goto LAB_002c1559;
          }
        }
        else {
          if (((piVar4[6] & 7U) != 2) || (*piVar4 < pAVar1->nTruePis)) goto LAB_002c1559;
          if (((*(uint *)&pAVar2->field_0x18 & 7) != 2) ||
             ((pAVar2->field_0).CioId < pAVar1->nTruePis)) goto LAB_002c1502;
        }
        if (pAVar2 == pAVar1->pConst1) {
          iVar3 = Abc_NtkTestScorrWriteEquivConst
                            (pNetlist,vId2Name,iVar3,(FILE *)__stream,(uint)piVar4[6] >> 3 & 1);
        }
        else {
          iVar3 = Abc_NtkTestScorrWriteEquivPair
                            (pNetlist,vId2Name,pAVar2->Id,iVar3,(FILE *)__stream,
                             (piVar4[6] ^ *(uint *)&pAVar2->field_0x18) >> 3 & 1);
        }
        uVar5 = uVar5 + iVar3;
      }
    }
LAB_002c1559:
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NtkTestScorrWriteEquivAig( Tst_Dat_t * pData )
{
    Abc_Ntk_t * pNetlist = pData->pNetlist;
    Vec_Int_t * vId2Name = pData->vId2Name;
    Aig_Man_t * pAig     = pData->pAig;
    char * pFileNameOut  = pData->pFileNameOut;
    FILE * pFile;
    Aig_Obj_t * pObj, * pRepr;
    int i, Counter = 0;
    if ( pData->fDumpBmc )
    {
        pData->fDumpBmc = 0;
        pFileNameOut = Abc_NtkBmcFileName( pFileNameOut );
    }
    pFile = fopen( pFileNameOut, "wb" );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) == NULL )
            continue;
        if ( pData->fFlopOnly )
        {
            if ( !Saig_ObjIsLo(pAig, pObj) || !(Saig_ObjIsLo(pAig, pRepr)||pRepr==Aig_ManConst1(pAig)) )
                continue;
        }
        else if ( pData->fFfNdOnly )
        {
            if ( !Saig_ObjIsLo(pAig, pObj) && !(Saig_ObjIsLo(pAig, pRepr)||pRepr==Aig_ManConst1(pAig)) )
                continue;
        }
        if ( pRepr == Aig_ManConst1(pAig) )
            Counter += Abc_NtkTestScorrWriteEquivConst( pNetlist, vId2Name, Aig_ObjId(pObj), pFile, Aig_ObjPhase(pObj) );
        else
            Counter += Abc_NtkTestScorrWriteEquivPair( pNetlist, vId2Name, Aig_ObjId(pRepr), Aig_ObjId(pObj), pFile, 
                Aig_ObjPhase(pRepr) ^ Aig_ObjPhase(pObj) );
    }
    fclose( pFile );
    printf( "%d pairs of sequentially equivalent nodes are written into file \"%s\".\n", Counter, pFileNameOut );
    return Counter;
}